

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O1

void idct16x16_low1_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  longlong lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar8;
  int iVar9;
  undefined1 auVar7 [16];
  uint uVar10;
  uint uVar12;
  uint uVar13;
  undefined1 auVar11 [16];
  uint uVar14;
  int iVar15;
  
  iVar5 = 1 << ((char)bit - 1U & 0x1f);
  auVar11 = ZEXT416((uint)bit);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + (long)bit * 0x100 + 0x1e0);
  auVar7._4_4_ = uVar1;
  auVar7._0_4_ = uVar1;
  auVar7._8_4_ = uVar1;
  auVar7._12_4_ = uVar1;
  auVar7 = pmulld(auVar7,(undefined1  [16])*in);
  iVar6 = bd + (uint)(do_cols == 0) * 2;
  iVar4 = 0x8000;
  if (0xf < iVar6 + 6) {
    iVar4 = 1 << ((char)iVar6 + 5U & 0x1f);
  }
  iVar6 = auVar7._0_4_ + iVar5 >> auVar11;
  iVar8 = auVar7._4_4_ + iVar5 >> auVar11;
  iVar9 = auVar7._8_4_ + iVar5 >> auVar11;
  iVar5 = auVar7._12_4_ + iVar5 >> auVar11;
  *(int *)*in = iVar6;
  *(int *)((long)*in + 4) = iVar8;
  *(int *)(*in + 1) = iVar9;
  *(int *)((long)*in + 0xc) = iVar5;
  if (do_cols == 0) {
    iVar4 = 10;
    if (10 < bd) {
      iVar4 = bd;
    }
    iVar4 = 0x20 << ((byte)iVar4 & 0x1f);
    iVar3 = -iVar4;
    iVar4 = iVar4 + -1;
    if (out_shift != 0) {
      iVar15 = (1 << ((byte)out_shift & 0x1f)) >> 1;
      auVar7 = ZEXT416((uint)out_shift);
      *(int *)*in = iVar6 + iVar15 >> auVar7;
      *(int *)((long)*in + 4) = iVar8 + iVar15 >> auVar7;
      *(int *)(*in + 1) = iVar9 + iVar15 >> auVar7;
      *(int *)((long)*in + 0xc) = iVar5 + iVar15 >> auVar7;
    }
  }
  else {
    iVar3 = -iVar4;
    iVar4 = iVar4 + -1;
  }
  iVar5 = (int)(*in)[0];
  iVar6 = *(int *)((long)*in + 4);
  iVar8 = (int)(*in)[1];
  iVar9 = *(int *)((long)*in + 0xc);
  uVar10 = (uint)(iVar3 < iVar5) * iVar5 | (uint)(iVar3 >= iVar5) * iVar3;
  uVar12 = (uint)(iVar3 < iVar6) * iVar6 | (uint)(iVar3 >= iVar6) * iVar3;
  uVar13 = (uint)(iVar3 < iVar8) * iVar8 | (uint)(iVar3 >= iVar8) * iVar3;
  uVar14 = (uint)(iVar3 < iVar9) * iVar9 | (uint)(iVar3 >= iVar9) * iVar3;
  uVar10 = (uint)(iVar4 < (int)uVar10) * iVar4 | (iVar4 >= (int)uVar10) * uVar10;
  uVar12 = (uint)(iVar4 < (int)uVar12) * iVar4 | (iVar4 >= (int)uVar12) * uVar12;
  uVar13 = (uint)(iVar4 < (int)uVar13) * iVar4 | (iVar4 >= (int)uVar13) * uVar13;
  uVar14 = (uint)(iVar4 < (int)uVar14) * iVar4 | (iVar4 >= (int)uVar14) * uVar14;
  *(uint *)*in = uVar10;
  *(uint *)((long)*in + 4) = uVar12;
  *(uint *)(*in + 1) = uVar13;
  *(uint *)((long)*in + 0xc) = uVar14;
  *(uint *)*out = uVar10;
  *(uint *)((long)*out + 4) = uVar12;
  *(uint *)(*out + 1) = uVar13;
  *(uint *)((long)*out + 0xc) = uVar14;
  lVar2 = (*in)[1];
  out[1][0] = (*in)[0];
  out[1][1] = lVar2;
  lVar2 = (*in)[1];
  out[2][0] = (*in)[0];
  out[2][1] = lVar2;
  lVar2 = (*in)[1];
  out[3][0] = (*in)[0];
  out[3][1] = lVar2;
  lVar2 = (*in)[1];
  out[4][0] = (*in)[0];
  out[4][1] = lVar2;
  lVar2 = (*in)[1];
  out[5][0] = (*in)[0];
  out[5][1] = lVar2;
  lVar2 = (*in)[1];
  out[6][0] = (*in)[0];
  out[6][1] = lVar2;
  lVar2 = (*in)[1];
  out[7][0] = (*in)[0];
  out[7][1] = lVar2;
  lVar2 = (*in)[1];
  out[8][0] = (*in)[0];
  out[8][1] = lVar2;
  lVar2 = (*in)[1];
  out[9][0] = (*in)[0];
  out[9][1] = lVar2;
  lVar2 = (*in)[1];
  out[10][0] = (*in)[0];
  out[10][1] = lVar2;
  lVar2 = (*in)[1];
  out[0xb][0] = (*in)[0];
  out[0xb][1] = lVar2;
  lVar2 = (*in)[1];
  out[0xc][0] = (*in)[0];
  out[0xc][1] = lVar2;
  lVar2 = (*in)[1];
  out[0xd][0] = (*in)[0];
  out[0xd][1] = lVar2;
  lVar2 = (*in)[1];
  out[0xe][0] = (*in)[0];
  out[0xe][1] = lVar2;
  lVar2 = (*in)[1];
  out[0xf][0] = (*in)[0];
  out[0xf][1] = lVar2;
  return;
}

Assistant:

static void idct16x16_low1_sse4_1(__m128i *in, __m128i *out, int bit,
                                  int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  // stage 0
  // stage 1
  // stage 2
  // stage 3
  // stage 4
  in[0] = _mm_mullo_epi32(in[0], cospi32);
  in[0] = _mm_add_epi32(in[0], rnding);
  in[0] = _mm_srai_epi32(in[0], bit);

  // stage 5
  // stage 6
  // stage 7
  if (!do_cols) {
    log_range = AOMMAX(16, bd + 6);
    clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
    clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
    if (out_shift != 0) {
      __m128i offset = _mm_set1_epi32((1 << out_shift) >> 1);
      in[0] = _mm_add_epi32(in[0], offset);
      in[0] = _mm_sra_epi32(in[0], _mm_cvtsi32_si128(out_shift));
    }
  }

  in[0] = _mm_max_epi32(in[0], clamp_lo);
  in[0] = _mm_min_epi32(in[0], clamp_hi);
  out[0] = in[0];
  out[1] = in[0];
  out[2] = in[0];
  out[3] = in[0];
  out[4] = in[0];
  out[5] = in[0];
  out[6] = in[0];
  out[7] = in[0];
  out[8] = in[0];
  out[9] = in[0];
  out[10] = in[0];
  out[11] = in[0];
  out[12] = in[0];
  out[13] = in[0];
  out[14] = in[0];
  out[15] = in[0];
}